

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-memory.c
# Opt level: O0

int run_test_get_memory(void)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uint64_t available_mem;
  uint64_t constrained_mem;
  uint64_t total_mem;
  uint64_t free_mem;
  
  lVar1 = uv_get_free_memory();
  lVar2 = uv_get_total_memory();
  uVar3 = uv_get_constrained_memory();
  lVar4 = uv_get_available_memory();
  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu, available_mem=%llu\n",lVar1,lVar2,
         uVar3,lVar4);
  if (lVar1 < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-memory.c"
            ,0x26,"free_mem",">","0",lVar1,">",0);
    abort();
  }
  if (lVar2 < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-memory.c"
            ,0x27,"total_mem",">","0",lVar2,">",0);
    abort();
  }
  if (lVar2 <= lVar1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-memory.c"
            ,0x2c,"total_mem",">","free_mem",lVar2,">",lVar1);
    abort();
  }
  if (lVar2 < lVar4) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-get-memory.c"
            ,0x2e,"available_mem","<=","total_mem",lVar4,"<=",lVar2);
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(get_memory) {
  uint64_t free_mem = uv_get_free_memory();
  uint64_t total_mem = uv_get_total_memory();
  uint64_t constrained_mem = uv_get_constrained_memory();
  uint64_t available_mem = uv_get_available_memory();

  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu, "
         "available_mem=%llu\n",
         (unsigned long long) free_mem,
         (unsigned long long) total_mem,
         (unsigned long long) constrained_mem,
         (unsigned long long) available_mem);

  ASSERT_GT(free_mem, 0);
  ASSERT_GT(total_mem, 0);
  /* On IBMi PASE, the amount of memory in use is always zero. */
#ifdef __PASE__
  ASSERT_EQ(total_mem, free_mem);
#else
  ASSERT_GT(total_mem, free_mem);
#endif
  ASSERT_LE(available_mem, total_mem);
  /* we'd really want to test if available <= free, but that is fragile:
   * with no limit set, get_available calls and returns get_free; so if
   * any memory was freed between our calls to get_free and get_available
   * we would fail such a test test (as observed on CI).
   */
  return 0;
}